

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper_tests.cpp
# Opt level: O2

void __thiscall dbwrapper_tests::existing_data_reindex::test_method(existing_data_reindex *this)

{
  long lVar1;
  bool bVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key_00;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  uint256 *puVar5;
  FastRandomContext *this_00;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  check_type cVar6;
  string *__return_storage_ptr__;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 local_338 [16];
  undefined1 *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  uint8_t key;
  unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> dbw;
  undefined1 local_1f8 [32];
  string local_1d8;
  uint256 res3;
  uint256 res2;
  CDBWrapper odbw;
  uint256 in2;
  uint256 res;
  uint256 in;
  path local_88;
  path ph;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  fs::operator/(&ph,(path *)&local_88,"existing_data_reindex");
  std::filesystem::__cxx11::path::~path(&local_88);
  fs::create_directories(&ph.super_path);
  std::filesystem::__cxx11::path::path((path *)&odbw,&ph.super_path);
  odbw.obfuscate_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x400;
  odbw.obfuscate_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  std::make_unique<CDBWrapper,DBParams>((DBParams *)&dbw);
  std::filesystem::__cxx11::path::~path((path *)&odbw);
  key = 'k';
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  RandomMixin<FastRandomContext>::rand256(&in,&this_00->super_RandomMixin<FastRandomContext>);
  res.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x103;
  file.m_begin = (iterator)&local_218;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_228,msg);
  bVar2 = CDBWrapper::Write<unsigned_char,uint256>
                    ((CDBWrapper *)
                     dbw._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>.
                     _M_t.super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                     super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl,&key,&in,false);
  res2.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_5b708d;
  in2.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"dbw->Write(key, in)" + 0x13;
  odbw.m_name._M_dataplus._M_p._0_1_ = 0;
  odbw.m_db_context._M_t.super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>
  ._M_t.super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
  super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl =
       (__uniq_ptr_data<LevelDBContext,_std::default_delete<LevelDBContext>,_true,_true>)
       &PTR__lazy_ostream_0113a070;
  odbw.m_name._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_230 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  odbw.m_name.field_2._M_allocated_capacity = (size_type)&in2;
  res2.super_base_blob<256U>.m_data._M_elems[0] = bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&res2,(lazy_ostream *)&odbw,1,0,WARN,_cVar6,(size_t)&local_238,
             0x103);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(res2.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  file_00.m_end = (iterator)0x104;
  file_00.m_begin = (iterator)&local_248;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_258,
             msg_00);
  res2.super_base_blob<256U>.m_data._M_elems[0] =
       CDBWrapper::Read<unsigned_char,uint256>
                 ((CDBWrapper *)
                  dbw._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
                  super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                  super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl,&key,&res);
  res2.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  in2.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_5b7098;
  in2.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"dbw->Read(key, res)" + 0x13;
  odbw.m_name._M_dataplus._M_p._0_1_ = 0;
  odbw.m_db_context._M_t.super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>
  ._M_t.super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
  super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl =
       (__uniq_ptr_data<LevelDBContext,_std::default_delete<LevelDBContext>,_true,_true>)
       &PTR__lazy_ostream_0113a070;
  odbw.m_name._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_260 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  odbw.m_name.field_2._M_allocated_capacity = (size_type)&in2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&res2,(lazy_ostream *)&odbw,1,0,WARN,_cVar6,(size_t)&local_268,
             0x104);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(res2.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  file_01.m_end = (iterator)0x105;
  file_01.m_begin = (iterator)&local_278;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_288,
             msg_01);
  odbw.m_name._M_dataplus._M_p._0_1_ = 0;
  odbw.m_db_context._M_t.super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>
  ._M_t.super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
  super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl =
       (__uniq_ptr_data<LevelDBContext,_std::default_delete<LevelDBContext>,_true,_true>)
       &PTR__lazy_ostream_01139f30;
  odbw.m_name._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
  odbw.m_name.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_290 = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)&res2,(base_blob<256u> *)&res);
  __return_storage_ptr__ = (string *)&in2;
  base_blob<256u>::ToString_abi_cxx11_(__return_storage_ptr__,(base_blob<256u> *)&in);
  pvVar3 = (iterator)0x2;
  puVar5 = &res2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&odbw,&local_298,0x105,1,2,puVar5,"res.ToString()",__return_storage_ptr__,
             "in.ToString()");
  std::__cxx11::string::~string((string *)&in2);
  std::__cxx11::string::~string((string *)&res2);
  std::__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>::reset
            ((__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_> *)&dbw,(pointer)0x0);
  std::filesystem::__cxx11::path::path((path *)&res2,&ph.super_path);
  CDBWrapper::CDBWrapper(&odbw,(DBParams *)&res2);
  std::filesystem::__cxx11::path::~path((path *)&res2);
  res2.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res2.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)puVar5;
  msg_02.m_begin = pvVar3;
  file_02.m_end = (iterator)0x10f;
  file_02.m_begin = (iterator)&local_2a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2b8,
             msg_02);
  bVar2 = CDBWrapper::Read<unsigned_char,uint256>(&odbw,&key,&res2);
  res3.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_338._0_8_ = "!odbw.Read(key, res2)";
  local_338._8_8_ = "";
  in2.super_base_blob<256U>.m_data._M_elems._8_8_ =
       in2.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  in2.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  in2.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_2c0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  in2.super_base_blob<256U>.m_data._M_elems._24_8_ = local_338;
  res3.super_base_blob<256U>.m_data._M_elems[0] = !bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&res3,(lazy_ostream *)&in2,1,0,WARN,
             (check_type)__return_storage_ptr__,(size_t)&local_2c8,0x10f);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(res3.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  file_03.m_end = (iterator)0x110;
  file_03.m_begin = (iterator)&local_2d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2e8,
             msg_03);
  key_00 = dbwrapper_private::GetObfuscateKey(&odbw);
  bVar2 = is_null_key(key_00);
  res3.super_base_blob<256U>.m_data._M_elems[0] = !bVar2;
  res3.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_338._0_8_ = "!is_null_key(dbwrapper_private::GetObfuscateKey(odbw))";
  local_338._8_8_ = "";
  in2.super_base_blob<256U>.m_data._M_elems._8_8_ =
       in2.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  in2.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  in2.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_2f0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  in2.super_base_blob<256U>.m_data._M_elems._24_8_ = local_338;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&res3,(lazy_ostream *)&in2,1,0,WARN,
             (check_type)__return_storage_ptr__,(size_t)&local_2f8,0x110);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(res3.super_base_blob<256U>.m_data._M_elems + 0x10));
  RandomMixin<FastRandomContext>::rand256(&in2,&this_00->super_RandomMixin<FastRandomContext>);
  res3.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  res3.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  file_04.m_end = (iterator)0x116;
  file_04.m_begin = (iterator)&local_308;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_318,
             msg_04);
  local_1d8._M_dataplus._M_p._0_1_ = CDBWrapper::Write<unsigned_char,uint256>(&odbw,&key,&in2,false)
  ;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_allocated_capacity = 0;
  local_1f8._0_8_ = "odbw.Write(key, in2)";
  local_1f8._8_8_ = (long)"odbw.Write(key, in2)" + 0x14;
  local_338._8_8_ = local_338._8_8_ & 0xffffffffffffff00;
  local_338._0_8_ = &PTR__lazy_ostream_0113a070;
  local_328 = boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_340 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_320 = local_1f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1d8,(lazy_ostream *)local_338,1,0,WARN,
             (check_type)__return_storage_ptr__,(size_t)&local_348,0x116);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1d8.field_2._M_allocated_capacity);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  file_05.m_end = (iterator)0x117;
  file_05.m_begin = (iterator)&local_358;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_368,
             msg_05);
  local_1d8._M_dataplus._M_p._0_1_ = CDBWrapper::Read<unsigned_char,uint256>(&odbw,&key,&res3);
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_allocated_capacity = 0;
  local_1f8._0_8_ = "odbw.Read(key, res3)";
  local_1f8._8_8_ = (long)"odbw.Read(key, res3)" + 0x14;
  local_338._8_8_ = local_338._8_8_ & 0xffffffffffffff00;
  local_338._0_8_ = &PTR__lazy_ostream_0113a070;
  local_328 = boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_370 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_320 = local_1f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1d8,(lazy_ostream *)local_338,1,0,WARN,
             (check_type)__return_storage_ptr__,(size_t)&local_378,0x117);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1d8.field_2._M_allocated_capacity);
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  file_06.m_end = (iterator)0x118;
  file_06.m_begin = (iterator)&local_388;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_398,
             msg_06);
  local_338._8_8_ = local_338._8_8_ & 0xffffffffffffff00;
  local_338._0_8_ = &PTR__lazy_ostream_01139f30;
  local_328 = boost::unit_test::lazy_ostream::inst;
  local_320 = "";
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
  ;
  local_3a0 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_1d8,(base_blob<256u> *)&res3);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_1f8,(base_blob<256u> *)&in2);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_338,&local_3a8,0x118,1,2,&local_1d8,"res3.ToString()",(string *)local_1f8,
             "in2.ToString()");
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  CDBWrapper::~CDBWrapper(&odbw);
  std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::~unique_ptr(&dbw);
  std::filesystem::__cxx11::path::~path(&ph.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(existing_data_reindex)
{
    // We're going to share this fs::path between two wrappers
    fs::path ph = m_args.GetDataDirBase() / "existing_data_reindex";
    fs::create_directories(ph);

    // Set up a non-obfuscated wrapper to write some initial data.
    std::unique_ptr<CDBWrapper> dbw = std::make_unique<CDBWrapper>(DBParams{.path = ph, .cache_bytes = 1 << 10, .memory_only = false, .wipe_data = false, .obfuscate = false});
    uint8_t key{'k'};
    uint256 in = m_rng.rand256();
    uint256 res;

    BOOST_CHECK(dbw->Write(key, in));
    BOOST_CHECK(dbw->Read(key, res));
    BOOST_CHECK_EQUAL(res.ToString(), in.ToString());

    // Call the destructor to free leveldb LOCK
    dbw.reset();

    // Simulate a -reindex by wiping the existing data store
    CDBWrapper odbw({.path = ph, .cache_bytes = 1 << 10, .memory_only = false, .wipe_data = true, .obfuscate = true});

    // Check that the key/val we wrote with unobfuscated wrapper doesn't exist
    uint256 res2;
    BOOST_CHECK(!odbw.Read(key, res2));
    BOOST_CHECK(!is_null_key(dbwrapper_private::GetObfuscateKey(odbw)));

    uint256 in2 = m_rng.rand256();
    uint256 res3;

    // Check that we can write successfully
    BOOST_CHECK(odbw.Write(key, in2));
    BOOST_CHECK(odbw.Read(key, res3));
    BOOST_CHECK_EQUAL(res3.ToString(), in2.ToString());
}